

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase_tests.cpp
# Opt level: O0

void __thiscall netbase_tests::caddress_unserialize_v1::test_method(caddress_unserialize_v1 *this)

{
  long lVar1;
  Span<const_unsigned_char> sp;
  long in_FS_OFFSET;
  ParamsWrapper<CAddress::SerParams,_std::vector<CAddress,_std::allocator<CAddress>_>_> PVar2;
  vector<CAddress,_std::allocator<CAddress>_> addresses_unserialized;
  DataStream s;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  *in_stack_fffffffffffffe98;
  undefined7 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea7;
  undefined7 in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffeaf;
  char *in_stack_fffffffffffffeb0;
  undefined7 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebf;
  uchar *in_stack_fffffffffffffec0;
  const_string *msg;
  size_t in_stack_fffffffffffffec8;
  vector<CAddress,_std::allocator<CAddress>_> *__x;
  string_view in_stack_ffffffffffffff00;
  lazy_ostream local_e0 [2];
  assertion_result local_c0 [2];
  ParamsWrapper<CAddress::SerParams,_std::vector<CAddress,_std::allocator<CAddress>_>_> local_88;
  vector<CAddress,_std::allocator<CAddress>_> local_78;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8),in_stack_fffffffffffffeb0
            );
  ParseHex<unsigned_char>(in_stack_ffffffffffffff00);
  Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((Span<const_unsigned_char> *)
             CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),in_stack_fffffffffffffe98
            );
  sp.m_size = in_stack_fffffffffffffec8;
  sp.m_data = in_stack_fffffffffffffec0;
  DataStream::DataStream
            ((DataStream *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),sp);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
  __x = &local_78;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_fffffffffffffe98);
  PVar2 = CAddress::SerParams::operator()
                    ((SerParams *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),
                     (vector<CAddress,_std::allocator<CAddress>_> *)
                     CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0));
  local_88 = PVar2;
  DataStream::operator>>
            ((DataStream *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),
             (ParamsWrapper<CAddress::SerParams,_std::vector<CAddress,_std::allocator<CAddress>_>_>
              *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0));
  do {
    msg = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),
               (pointer)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
               (unsigned_long)in_stack_fffffffffffffe98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)PVar2.m_params,(const_string *)PVar2.m_object,(size_t)__x,msg);
    std::operator==(__x,(vector<CAddress,_std::allocator<CAddress>_> *)msg);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),
               (bool)in_stack_fffffffffffffea7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),
               (pointer)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
               (unsigned_long)in_stack_fffffffffffffe98);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
               (basic_cstring<const_char> *)in_stack_fffffffffffffe98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),
               (pointer)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
               (unsigned_long)in_stack_fffffffffffffe98);
    in_stack_fffffffffffffe98 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_c0,local_e0,(const_string *)&stack0xffffffffffffff00,0x240,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffffe98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffe98);
    in_stack_fffffffffffffeaf = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffeaf);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)
             CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
  DataStream::~DataStream((DataStream *)in_stack_fffffffffffffe98);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(caddress_unserialize_v1)
{
    DataStream s{ParseHex(stream_addrv1_hex)};
    std::vector<CAddress> addresses_unserialized;

    s >> CAddress::V1_NETWORK(addresses_unserialized);
    BOOST_CHECK(fixture_addresses == addresses_unserialized);
}